

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::CFloatFunc1::~CFloatFunc1(CFloatFunc1 *this)

{
  CFloatFunc1 *this_local;
  
  (this->super_FloatFunc1).
  super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .
  super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_032dd620;
  std::__cxx11::string::~string((string *)&this->m_name);
  FloatFunc1::~FloatFunc1(&this->super_FloatFunc1);
  return;
}

Assistant:

CFloatFunc1	(const string& name, DoubleFunc1& func)
				: m_name(name), m_func(func) {}